

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O1

void __thiscall TApp_SetWithDefaults_Test::TestBody(TApp_SetWithDefaults_Test *this)

{
  bool bVar1;
  long lVar2;
  initializer_list<int> __l;
  int someint;
  allocator_type local_e9;
  AssertHelper local_e8;
  int local_dc;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  undefined8 uStack_d0;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  string local_98;
  string local_78;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_58;
  
  local_dc = 2;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-a","");
  local_d8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x200000001;
  uStack_d0 = 0x400000003;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_d8;
  CLI::std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_58,__l,(less<int> *)&local_e8,
             &local_e9);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"","");
  CLI::App::add_set<int>
            (&(this->super_TApp).app,&local_78,&local_dc,
             (set<int,_std::less<int>,_std::allocator<int>_> *)&local_58,&local_98,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  CLI::std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  local_d8.ptr_ = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"-a1","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"-a2","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,&local_d8,&local_98);
  lVar2 = 0;
  do {
    if (local_a8 + lVar2 != *(undefined1 **)((long)local_b8 + lVar2)) {
      operator_delete(*(undefined1 **)((long)local_b8 + lVar2));
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)&local_d8);
  testing::internal::AssertHelper::AssertHelper
            (&local_e8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x50b,
             "Expected: run() throws an exception of type CLI::ArgumentMismatch.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_d8);
  testing::internal::AssertHelper::~AssertHelper(&local_e8);
  if (((local_d8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_d8.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_d8.ptr_ + 8))();
  }
  return;
}

Assistant:

TEST_F(TApp, SetWithDefaults) {
    int someint = 2;
    app.add_set("-a", someint, {1, 2, 3, 4}, "", true);

    args = {"-a1", "-a2"};

    EXPECT_THROW(run(), CLI::ArgumentMismatch);
}